

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_vertexbuffer.cpp
# Opt level: O0

void __thiscall FFlatVertexBuffer::FFlatVertexBuffer(FFlatVertexBuffer *this,int width,int height)

{
  FFlatVertex *pFVar1;
  FFlatVertex *__src;
  uint bytesize_1;
  uint bytesize;
  int height_local;
  int width_local;
  FFlatVertexBuffer *this_local;
  
  FVertexBuffer::FVertexBuffer(&this->super_FVertexBuffer,(bool)(~gl.legacyMode & 1));
  (this->super_FVertexBuffer)._vptr_FVertexBuffer = (_func_int **)&PTR__FFlatVertexBuffer_00b66a28;
  TArray<FFlatVertex,_FFlatVertex>::TArray(&this->vbo_shadowdata);
  if (gl.buffermethod == 1) {
    (*_ptrc_glBindBuffer)(0x8892,(this->super_FVertexBuffer).vbo_id);
    (*_ptrc_glBufferData)(0x8892,40000000,(void *)0x0,0x88e0);
    this->map = (FFlatVertex *)0x0;
    DPrintf(3,"Using deferred buffer\n");
  }
  else if (gl.buffermethod == 2) {
    (*_ptrc_glBindBuffer)(0x8892,(this->super_FVertexBuffer).vbo_id);
    (*_ptrc_glBufferStorage)(0x8892,40000000,(void *)0x0,0xc2);
    pFVar1 = (FFlatVertex *)(*_ptrc_glMapBufferRange)(0x8892,0,40000000,0xc2);
    this->map = pFVar1;
    DPrintf(3,"Using persistent buffer\n");
  }
  else {
    pFVar1 = (FFlatVertex *)operator_new__(40000000);
    this->map = pFVar1;
    DPrintf(3,"Using client array buffer\n");
  }
  this->mCurIndex = 0;
  this->mIndex = 0;
  this->mNumReserved = 0x14;
  TArray<FFlatVertex,_FFlatVertex>::Resize(&this->vbo_shadowdata,this->mNumReserved);
  pFVar1 = TArray<FFlatVertex,_FFlatVertex>::operator[](&this->vbo_shadowdata,0);
  FFlatVertex::Set(pFVar1,0.0,0.0,0.0,0.0,0.0);
  pFVar1 = TArray<FFlatVertex,_FFlatVertex>::operator[](&this->vbo_shadowdata,1);
  FFlatVertex::Set(pFVar1,1.0,0.0,0.0,0.0,0.0);
  pFVar1 = TArray<FFlatVertex,_FFlatVertex>::operator[](&this->vbo_shadowdata,2);
  FFlatVertex::Set(pFVar1,2.0,0.0,0.0,0.0,0.0);
  pFVar1 = TArray<FFlatVertex,_FFlatVertex>::operator[](&this->vbo_shadowdata,3);
  FFlatVertex::Set(pFVar1,3.0,0.0,0.0,0.0,0.0);
  pFVar1 = TArray<FFlatVertex,_FFlatVertex>::operator[](&this->vbo_shadowdata,4);
  FFlatVertex::Set(pFVar1,0.0,0.0,0.0,0.0,0.0);
  pFVar1 = TArray<FFlatVertex,_FFlatVertex>::operator[](&this->vbo_shadowdata,5);
  FFlatVertex::Set(pFVar1,0.0,(float)height,0.0,0.0,0.0);
  pFVar1 = TArray<FFlatVertex,_FFlatVertex>::operator[](&this->vbo_shadowdata,6);
  FFlatVertex::Set(pFVar1,(float)width,0.0,0.0,0.0,0.0);
  pFVar1 = TArray<FFlatVertex,_FFlatVertex>::operator[](&this->vbo_shadowdata,7);
  FFlatVertex::Set(pFVar1,(float)width,(float)height,0.0,0.0,0.0);
  pFVar1 = TArray<FFlatVertex,_FFlatVertex>::operator[](&this->vbo_shadowdata,8);
  FFlatVertex::Set(pFVar1,-1.0,-1.0,0.0,0.0,0.0);
  pFVar1 = TArray<FFlatVertex,_FFlatVertex>::operator[](&this->vbo_shadowdata,9);
  FFlatVertex::Set(pFVar1,-1.0,1.0,0.0,0.0,1.0);
  pFVar1 = TArray<FFlatVertex,_FFlatVertex>::operator[](&this->vbo_shadowdata,10);
  FFlatVertex::Set(pFVar1,1.0,-1.0,0.0,1.0,0.0);
  pFVar1 = TArray<FFlatVertex,_FFlatVertex>::operator[](&this->vbo_shadowdata,0xb);
  FFlatVertex::Set(pFVar1,1.0,1.0,0.0,1.0,1.0);
  pFVar1 = TArray<FFlatVertex,_FFlatVertex>::operator[](&this->vbo_shadowdata,0xc);
  FFlatVertex::Set(pFVar1,-32767.0,32767.0,-32767.0,0.0,0.0);
  pFVar1 = TArray<FFlatVertex,_FFlatVertex>::operator[](&this->vbo_shadowdata,0xd);
  FFlatVertex::Set(pFVar1,-32767.0,32767.0,32767.0,0.0,0.0);
  pFVar1 = TArray<FFlatVertex,_FFlatVertex>::operator[](&this->vbo_shadowdata,0xe);
  FFlatVertex::Set(pFVar1,32767.0,32767.0,32767.0,0.0,0.0);
  pFVar1 = TArray<FFlatVertex,_FFlatVertex>::operator[](&this->vbo_shadowdata,0xf);
  FFlatVertex::Set(pFVar1,32767.0,32767.0,-32767.0,0.0,0.0);
  pFVar1 = TArray<FFlatVertex,_FFlatVertex>::operator[](&this->vbo_shadowdata,0x10);
  FFlatVertex::Set(pFVar1,-32767.0,-32767.0,-32767.0,0.0,0.0);
  pFVar1 = TArray<FFlatVertex,_FFlatVertex>::operator[](&this->vbo_shadowdata,0x11);
  FFlatVertex::Set(pFVar1,-32767.0,-32767.0,32767.0,0.0,0.0);
  pFVar1 = TArray<FFlatVertex,_FFlatVertex>::operator[](&this->vbo_shadowdata,0x12);
  FFlatVertex::Set(pFVar1,32767.0,-32767.0,32767.0,0.0,0.0);
  pFVar1 = TArray<FFlatVertex,_FFlatVertex>::operator[](&this->vbo_shadowdata,0x13);
  FFlatVertex::Set(pFVar1,32767.0,-32767.0,-32767.0,0.0,0.0);
  if (gl.buffermethod == 1) {
    Map(this);
    pFVar1 = this->map;
    __src = TArray<FFlatVertex,_FFlatVertex>::operator[](&this->vbo_shadowdata,0);
    memcpy(pFVar1,__src,(ulong)this->mNumReserved * 0x14);
    Unmap(this);
  }
  return;
}

Assistant:

FFlatVertexBuffer::FFlatVertexBuffer(int width, int height)
: FVertexBuffer(!gl.legacyMode)
{
	switch (gl.buffermethod)
	{
	case BM_PERSISTENT:
	{
		unsigned int bytesize = BUFFER_SIZE * sizeof(FFlatVertex);
		glBindBuffer(GL_ARRAY_BUFFER, vbo_id);
		glBufferStorage(GL_ARRAY_BUFFER, bytesize, NULL, GL_MAP_WRITE_BIT | GL_MAP_PERSISTENT_BIT | GL_MAP_COHERENT_BIT);
		map = (FFlatVertex*)glMapBufferRange(GL_ARRAY_BUFFER, 0, bytesize, GL_MAP_WRITE_BIT | GL_MAP_PERSISTENT_BIT | GL_MAP_COHERENT_BIT);
		DPrintf(DMSG_NOTIFY, "Using persistent buffer\n");
		break;
	}

	case BM_DEFERRED:
	{
		unsigned int bytesize = BUFFER_SIZE * sizeof(FFlatVertex);
		glBindBuffer(GL_ARRAY_BUFFER, vbo_id);
		glBufferData(GL_ARRAY_BUFFER, bytesize, NULL, GL_STREAM_DRAW);
		map = nullptr;
		DPrintf(DMSG_NOTIFY, "Using deferred buffer\n");
		break;
	}

	default:
	{
		map = new FFlatVertex[BUFFER_SIZE];
		DPrintf(DMSG_NOTIFY, "Using client array buffer\n");
		break;
	}
	}
	mIndex = mCurIndex = 0;
	mNumReserved = NUM_RESERVED;
	vbo_shadowdata.Resize(mNumReserved);

	// the first quad is reserved for handling coordinates through uniforms.
	vbo_shadowdata[0].Set(0, 0, 0, 0, 0);
	vbo_shadowdata[1].Set(1, 0, 0, 0, 0);
	vbo_shadowdata[2].Set(2, 0, 0, 0, 0);
	vbo_shadowdata[3].Set(3, 0, 0, 0, 0);

	// and the second one for the fullscreen quad used for blend overlays.
	vbo_shadowdata[4].Set(0, 0, 0, 0, 0);
	vbo_shadowdata[5].Set(0, (float)height, 0, 0, 0);
	vbo_shadowdata[6].Set((float)width, 0, 0, 0, 0);
	vbo_shadowdata[7].Set((float)width, (float)height, 0, 0, 0);

	// and this is for the postprocessing copy operation
	vbo_shadowdata[8].Set(-1.0f, -1.0f, 0, 0.0f, 0.0f);
	vbo_shadowdata[9].Set(-1.0f, 1.0f, 0, 0.0f, 1.f);
	vbo_shadowdata[10].Set(1.0f, -1.0f, 0, 1.f, 0.0f);
	vbo_shadowdata[11].Set(1.0f, 1.0f, 0, 1.f, 1.f);

	// The next two are the stencil caps.
	vbo_shadowdata[12].Set(-32767.0f, 32767.0f, -32767.0f, 0, 0);
	vbo_shadowdata[13].Set(-32767.0f, 32767.0f, 32767.0f, 0, 0);
	vbo_shadowdata[14].Set(32767.0f, 32767.0f, 32767.0f, 0, 0);
	vbo_shadowdata[15].Set(32767.0f, 32767.0f, -32767.0f, 0, 0);

	vbo_shadowdata[16].Set(-32767.0f, -32767.0f, -32767.0f, 0, 0);
	vbo_shadowdata[17].Set(-32767.0f, -32767.0f, 32767.0f, 0, 0);
	vbo_shadowdata[18].Set(32767.0f, -32767.0f, 32767.0f, 0, 0);
	vbo_shadowdata[19].Set(32767.0f, -32767.0f, -32767.0f, 0, 0);

	if (gl.buffermethod == BM_DEFERRED)
	{
		Map();
		memcpy(map, &vbo_shadowdata[0], mNumReserved * sizeof(FFlatVertex));
		Unmap();
	}

}